

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::fillStencilData
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  uint uVar1;
  GLubyte *__s;
  uint uVar2;
  uint uVar3;
  CubeMapArrayDataStorage *pCVar4;
  uint uVar5;
  
  pCVar4 = this->m_cube_map_array_data;
  __s = pCVar4[test_index].m_data_array;
  uVar5 = 0;
  memset(__s,0,(ulong)(pCVar4[test_index].m_width * pCVar4[test_index].m_height *
                       pCVar4[test_index].m_depth * 4));
  if (this->m_cube_map_array_data[test_index].m_depth != 0) {
    do {
      pCVar4 = this->m_cube_map_array_data;
      if (pCVar4[test_index].m_width != 0) {
        uVar2 = 0;
        do {
          uVar3 = pCVar4[test_index].m_height >> 1;
          while( true ) {
            uVar1 = this->m_cube_map_array_data[test_index].m_height;
            if (uVar1 <= uVar3) break;
            builtin_memcpy(__s + ((this->m_cube_map_array_data[test_index].m_width * uVar5 + uVar3)
                                  * uVar1 + uVar2) * 4,"\x01\x01\x01\x01",4);
            uVar3 = uVar3 + 1;
          }
          uVar2 = uVar2 + 1;
          pCVar4 = this->m_cube_map_array_data;
        } while (uVar2 < pCVar4[test_index].m_width);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_cube_map_array_data[test_index].m_depth);
  }
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::fillStencilData(glw::GLuint test_index)
{
	glw::GLubyte* const data = m_cube_map_array_data[test_index].getDataArray();

	memset(data, 0, m_cube_map_array_data[test_index].getArraySize() * sizeof(glw::GLubyte));

	for (glw::GLuint depth_index = 0; depth_index < m_cube_map_array_data[test_index].getDepth(); depth_index++)
	{
		for (glw::GLuint x = 0; x < m_cube_map_array_data[test_index].getWidth(); x++)
		{
			for (glw::GLuint y = m_cube_map_array_data[test_index].getHeight() / 2;
				 y < m_cube_map_array_data[test_index].getHeight(); y++)
			{
				glw::GLuint depth_position_in_array = m_cube_map_array_data[test_index].getWidth() *
													  m_cube_map_array_data[test_index].getHeight() * m_n_components *
													  depth_index;

				glw::GLuint y_position_in_array = m_cube_map_array_data[test_index].getHeight() * m_n_components * y;

				glw::GLuint x_position_in_array = m_n_components * x;

				glw::GLuint index_array = depth_position_in_array + y_position_in_array + x_position_in_array;

				memset((data + index_array), 1, m_n_components);

			} /* for (all rows) */
		}	 /* for (all columns) */
	}		  /* for (all layers) */
}